

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_scalar.c
# Opt level: O0

void scalar_define_bang(_glist *x)

{
  undefined1 local_28 [8];
  t_gpointer gp;
  _glist *x_local;
  
  gp.gp_stub = (t_gstub *)x;
  if ((x->gl_list == (t_gobj *)0x0) || (x->gl_list->g_pd != scalar_class)) {
    bug("scalar_define_bang");
  }
  else {
    gpointer_init((t_gpointer *)local_28);
    gpointer_setglist((t_gpointer *)local_28,(_glist *)gp.gp_stub,
                      (t_scalar *)gp.gp_stub[3].gs_un.gs_glist);
    outlet_pointer(*(_outlet **)&gp.gp_stub[1].gs_which,(t_gpointer *)local_28);
    gpointer_unset((t_gpointer *)local_28);
  }
  return;
}

Assistant:

static void scalar_define_bang(t_glist *x)
{
    if (x->gl_list && pd_class(&x->gl_list->g_pd) == scalar_class)
    {
        t_gpointer gp;
        gpointer_init(&gp);
        gpointer_setglist(&gp, x, (t_scalar *)&x->gl_list->g_pd);
        outlet_pointer(x->gl_obj.ob_outlet, &gp);
        gpointer_unset(&gp);
    }
    else bug("scalar_define_bang");
}